

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGenerator::ResolveLanguageCompiler
          (cmGlobalGenerator *this,string *lang,cmMakefile *mf,bool optional)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  cmState *pcVar3;
  bool bVar4;
  int iVar5;
  cmValue cVar6;
  string *in_name;
  cmValue cVar7;
  undefined8 uVar8;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view arg;
  string cnameString;
  string pathString;
  string path;
  string langComp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cnameArgVec;
  undefined1 local_118 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  string local_b8;
  string local_98;
  undefined8 local_78;
  char *local_70;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_98.field_2._8_8_ = (lang->_M_dataplus)._M_p;
  local_98.field_2._M_allocated_capacity = lang->_M_string_length;
  local_98._M_dataplus._M_p = &DAT_00000006;
  local_98._M_string_length = 0x6a4306;
  local_78 = 9;
  local_70 = "_COMPILER";
  views._M_len = 3;
  views._M_array = (iterator)&local_98;
  cmCatViews_abi_cxx11_(&local_68,views);
  cVar6 = cmMakefile::GetDefinition(mf,&local_68);
  if (cVar6.Value == (string *)0x0) {
    if (optional) goto LAB_0040f3ec;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_68._M_dataplus._M_p,
               local_68._M_dataplus._M_p + local_68._M_string_length);
    std::__cxx11::string::append((char *)&local_98);
    cmSystemTools::Error(&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) goto LAB_0040f3ec;
  }
  else {
    in_name = cmMakefile::GetRequiredDefinition(mf,&local_68);
    local_98._M_string_length = 0;
    local_98.field_2._M_allocated_capacity =
         local_98.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    bVar4 = cmsys::SystemTools::FileIsFullPath(in_name);
    if (bVar4) {
      std::__cxx11::string::_M_assign((string *)&local_98);
    }
    else {
      local_f8._M_allocated_capacity = 0;
      local_f8._8_8_ = 0;
      local_e8._M_allocated_capacity = 0;
      cmsys::SystemTools::FindProgram
                (&local_b8,in_name,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_f8,false);
      std::__cxx11::string::operator=((string *)&local_98,(string *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,
                        CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                 local_b8.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_f8);
    }
    if ((optional) ||
       (((char *)local_98._M_string_length != (char *)0x0 &&
        (bVar4 = cmsys::SystemTools::FileExists(&local_98), bVar4)))) {
      cVar6 = cmState::GetInitializedCacheValue
                        ((this->CMakeInstance->State)._M_t.
                         super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                         super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                         super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&local_68);
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (cVar6.Value != (string *)0x0) {
        if ((cVar6.Value)->_M_string_length != 0) {
          arg._M_str = ((cVar6.Value)->_M_dataplus)._M_p;
          arg._M_len = (cVar6.Value)->_M_string_length;
          cmExpandList(arg,&local_48,false);
          cVar6.Value = local_48.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
        }
        paVar1 = &local_b8.field_2;
        local_b8._M_string_length = 0;
        local_b8.field_2._M_local_buf[0] = '\0';
        local_b8._M_dataplus._M_p = (pointer)paVar1;
        if (cVar6.Value != (string *)0x0 && !optional) {
          local_f8._M_allocated_capacity = (size_type)&local_e8;
          local_f8._8_8_ = 0;
          local_e8._M_allocated_capacity = local_e8._M_allocated_capacity & 0xffffffffffffff00;
          bVar4 = cmsys::SystemTools::FileIsFullPath(cVar6.Value);
          if (bVar4) {
            std::__cxx11::string::_M_assign((string *)local_f8._M_local_buf);
          }
          else {
            local_118._0_8_ = (pointer)0x0;
            local_118._8_8_ = (pointer)0x0;
            local_118._16_8_ = (pointer)0x0;
            cmsys::SystemTools::FindProgram
                      ((string *)&local_d8,cVar6.Value,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_118,false);
            std::__cxx11::string::operator=
                      ((string *)local_f8._M_local_buf,(string *)local_d8._M_local_buf);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_allocated_capacity != &local_c8) {
              operator_delete((void *)local_d8._M_allocated_capacity,
                              local_c8._M_allocated_capacity + 1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_118);
          }
          local_d8._M_allocated_capacity = (size_type)&local_c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,local_98._M_dataplus._M_p,
                     (char *)(local_98._M_string_length + (long)local_98._M_dataplus._M_p));
          cmsys::SystemTools::ConvertToUnixSlashes((string *)&local_f8);
          cmsys::SystemTools::ConvertToUnixSlashes((string *)&local_d8);
          uVar8 = local_d8._M_allocated_capacity;
          if ((local_f8._8_8_ != local_d8._8_8_) ||
             ((local_f8._8_8_ != 0 &&
              (iVar5 = bcmp((void *)local_f8._M_allocated_capacity,
                            (void *)local_d8._M_allocated_capacity,local_f8._8_8_), iVar5 != 0)))) {
            pcVar3 = (this->CMakeInstance->State)._M_t.
                     super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                     super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                     super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
            pbVar2 = (pointer)(local_118 + 0x10);
            local_118._0_8_ = pbVar2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_118,"__CMAKE_DELETE_CACHE_CHANGE_VARS_","");
            cVar7 = cmState::GetGlobalProperty(pcVar3,(string *)local_118);
            if ((pointer)local_118._0_8_ != pbVar2) {
              operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
            }
            if (cVar7.Value != (string *)0x0) {
              std::__cxx11::string::_M_append
                        ((char *)&local_b8,(ulong)((cVar7.Value)->_M_dataplus)._M_p);
              std::__cxx11::string::append((char *)&local_b8);
            }
            std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_68._M_dataplus._M_p);
            std::__cxx11::string::append((char *)&local_b8);
            std::__cxx11::string::_M_append
                      ((char *)&local_b8,(ulong)((cVar6.Value)->_M_dataplus)._M_p);
            pcVar3 = (this->CMakeInstance->State)._M_t.
                     super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                     super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                     super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
            local_118._0_8_ = pbVar2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_118,"__CMAKE_DELETE_CACHE_CHANGE_VARS_","");
            cmState::SetGlobalProperty(pcVar3,(string *)local_118,local_b8._M_dataplus._M_p);
            uVar8 = local_d8._M_allocated_capacity;
            if ((pointer)local_118._0_8_ != pbVar2) {
              operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
              uVar8 = local_d8._M_allocated_capacity;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar8 != &local_c8) {
            operator_delete((void *)uVar8,local_c8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_allocated_capacity != &local_e8) {
            operator_delete((void *)local_f8._M_allocated_capacity,
                            local_e8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != paVar1) {
            operator_delete(local_b8._M_dataplus._M_p,
                            CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                     local_b8.field_2._M_local_buf[0]) + 1);
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) goto LAB_0040f3ec;
  }
  operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
LAB_0040f3ec:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::ResolveLanguageCompiler(const std::string& lang,
                                                cmMakefile* mf,
                                                bool optional) const
{
  std::string langComp = cmStrCat("CMAKE_", lang, "_COMPILER");

  if (!mf->GetDefinition(langComp)) {
    if (!optional) {
      cmSystemTools::Error(langComp + " not set, after EnableLanguage");
    }
    return;
  }
  std::string const& name = mf->GetRequiredDefinition(langComp);
  std::string path;
  if (!cmSystemTools::FileIsFullPath(name)) {
    path = cmSystemTools::FindProgram(name);
  } else {
    path = name;
  }
  if (!optional && (path.empty() || !cmSystemTools::FileExists(path))) {
    return;
  }
  cmValue cname =
    this->GetCMakeInstance()->GetState()->GetInitializedCacheValue(langComp);

  // Split compiler from arguments
  std::vector<std::string> cnameArgVec;
  if (cname && !cname->empty()) {
    cmExpandList(*cname, cnameArgVec);
    cname = cmValue(cnameArgVec.front());
  }

  std::string changeVars;
  if (cname && !optional) {
    std::string cnameString;
    if (!cmSystemTools::FileIsFullPath(*cname)) {
      cnameString = cmSystemTools::FindProgram(*cname);
    } else {
      cnameString = *cname;
    }
    std::string pathString = path;
    // get rid of potentially multiple slashes:
    cmSystemTools::ConvertToUnixSlashes(cnameString);
    cmSystemTools::ConvertToUnixSlashes(pathString);
    if (cnameString != pathString) {
      cmValue cvars = this->GetCMakeInstance()->GetState()->GetGlobalProperty(
        "__CMAKE_DELETE_CACHE_CHANGE_VARS_");
      if (cvars) {
        changeVars += *cvars;
        changeVars += ";";
      }
      changeVars += langComp;
      changeVars += ";";
      changeVars += *cname;
      this->GetCMakeInstance()->GetState()->SetGlobalProperty(
        "__CMAKE_DELETE_CACHE_CHANGE_VARS_", changeVars.c_str());
    }
  }
}